

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall
Catch::ConsoleReporter::sectionEnded(ConsoleReporter *this,SectionStats *_sectionStats)

{
  ostream *poVar1;
  Colour colour;
  
  if (_sectionStats->missingAssertions == true) {
    lazyPrint(this);
    Colour::Colour(&colour,BrightRed);
    poVar1 = std::operator<<((this->super_StreamingReporterBase).stream,
                             "\nNo assertions in section, \'");
    poVar1 = std::operator<<(poVar1,(string *)&_sectionStats->sectionInfo);
    poVar1 = std::operator<<(poVar1,"\'\n");
    std::endl<char,std::char_traits<char>>(poVar1);
    Colour::~Colour(&colour);
  }
  this->m_headerPrinted = false;
  StreamingReporterBase::sectionEnded(&this->super_StreamingReporterBase,_sectionStats);
  return;
}

Assistant:

virtual void sectionEnded( SectionStats const& _sectionStats ) {
            if( _sectionStats.missingAssertions ) {
                lazyPrint();
                Colour colour( Colour::ResultError );
                stream << "\nNo assertions in section, '" << _sectionStats.sectionInfo.name << "'\n" << std::endl;
            }
            m_headerPrinted = false;
            StreamingReporterBase::sectionEnded( _sectionStats );
        }